

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O1

void __thiscall
cmXMLWriter::Attribute<unsigned_long>(cmXMLWriter *this,char *name,unsigned_long *value)

{
  size_t sVar1;
  ostream *poVar2;
  char local_19;
  
  PreAttribute(this);
  poVar2 = this->Output;
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_19 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }